

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

double __thiscall
Problem_CGBG_FF::GetHouseReward(Problem_CGBG_FF *this,Index fl,size_t nrAgentsPresent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_RDX;
  int in_ESI;
  undefined1 in_ZMM0 [64];
  double reward;
  double discount;
  double base_penalty;
  undefined8 local_8;
  
  if (in_ESI == 0) {
    local_8 = 0.0;
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_ESI);
    auVar2 = vcvtusi2sd_avx512f(auVar1,in_RDX);
    local_8 = pow(0.7,auVar2._0_8_);
    local_8 = -auVar1._0_8_ * local_8;
  }
  return local_8;
}

Assistant:

double Problem_CGBG_FF::GetHouseReward(Index fl, size_t nrAgentsPresent) const
{
#if 1
    if (fl==0)
        return 0.0;
    
    double base_penalty = fl;
    double discount = pow(0.7, (double)nrAgentsPresent);    
    double reward = -base_penalty * discount;
    //cout << "discount="<<discount<<", reward="<<reward<<endl;
    return reward;
#else
    
    // if there are 2 or more agents present, they can extinguish the
    // fire completely
    switch(nrAgentsPresent)
    {
    case 0:
    case 1:
    {
        double base_penalty = fl;
        return(-1.0 * base_penalty);
    }
    default:
        return(0.0);
    }
#endif
}